

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

iterator * __thiscall
idx2::Insert<unsigned_long,idx2::chunk_exp_info>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht,unsigned_long *Key,chunk_exp_info *Val
          )

{
  unsigned_long *puVar1;
  ulong uVar2;
  
  if (7L << ((byte)this[0x20] & 0x3f) <= *(long *)(this + 0x18) * 10) {
    IncreaseCapacity<unsigned_long,idx2::chunk_exp_info>
              ((hash_table<unsigned_long,_idx2::chunk_exp_info> *)this);
  }
  puVar1 = Ht->Keys;
  uVar2 = (ulong)((long)puVar1 * -0x61c8864680b583eb) >>
          (-(byte)*(undefined8 *)(this + 0x20) & 0x3f);
  if (*(char *)(*(long *)(this + 0x10) + uVar2) == '\x02') {
    do {
      if (*(unsigned_long **)(*(long *)this + uVar2 * 8) == puVar1) break;
      uVar2 = uVar2 + 1 & ~(-1L << ((byte)*(undefined8 *)(this + 0x20) & 0x3f));
    } while (*(char *)(*(long *)(this + 0x10) + uVar2) == '\x02');
  }
  *(unsigned_long **)(*(long *)this + uVar2 * 8) = puVar1;
  memcpy((void *)(*(long *)(this + 8) + uVar2 * 0x90),Key,0x90);
  if (*(char *)(*(long *)(this + 0x10) + uVar2) != '\x02') {
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    *(undefined1 *)(*(long *)(this + 0x10) + uVar2) = 2;
  }
  __return_storage_ptr__->Key = (unsigned_long *)(uVar2 * 8 + *(long *)this);
  __return_storage_ptr__->Val = (chunk_exp_info *)(uVar2 * 0x90 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)this;
  __return_storage_ptr__->Idx = uVar2;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Insert(hash_table<k, v>* Ht, const k& Key, const v& Val)
{
  if (Size(*Ht) * 10 >= Capacity(*Ht) * 7)
    IncreaseCapacity(Ht);

  i64 H = Index(*Ht, Hash(Key));
  while (Ht->Stats[H] == hash_table<k, v>::Occupied && !(Ht->Keys[H] == Key))
  {
    ++H;
    H &= Capacity(*Ht) - 1;
  }

  Ht->Keys[H] = Key;
  Ht->Vals[H] = Val;
  if (Ht->Stats[H] != hash_table<k, v>::Occupied)
  {
    ++Ht->Size;
    Ht->Stats[H] = hash_table<k, v>::Occupied;
  }

  return IterAt(*Ht, H);
}